

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_type_safe::boolean_&,_const_type_safe::boolean_&> * __thiscall
Catch::ExprLhs<type_safe::boolean_const&>::operator!=
          (BinaryExpr<const_type_safe::boolean_&,_const_type_safe::boolean_&>
           *__return_storage_ptr__,ExprLhs<type_safe::boolean_const&> *this,boolean *rhs)

{
  boolean *lhs;
  bool comparisonResult;
  StringRef local_30;
  boolean *local_20;
  boolean *rhs_local;
  ExprLhs<const_type_safe::boolean_&> *this_local;
  
  local_20 = rhs;
  rhs_local = (boolean *)this;
  this_local = (ExprLhs<const_type_safe::boolean_&> *)__return_storage_ptr__;
  comparisonResult =
       compareNotEqual<type_safe::boolean,type_safe::boolean_const&>(*(boolean **)this,rhs);
  lhs = *(boolean **)this;
  StringRef::StringRef(&local_30,"!=");
  BinaryExpr<const_type_safe::boolean_&,_const_type_safe::boolean_&>::BinaryExpr
            (__return_storage_ptr__,comparisonResult,lhs,local_30,local_20);
  return __return_storage_ptr__;
}

Assistant:

auto operator != ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareNotEqual( m_lhs, rhs ), m_lhs, "!=", rhs };
        }